

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O0

void __thiscall SslUdpSocketImpl::~SslUdpSocketImpl(SslUdpSocketImpl *this)

{
  SslUdpSocketImpl *this_local;
  
  ~SslUdpSocketImpl(this);
  operator_delete(this,0x3f8);
  return;
}

Assistant:

SslUdpSocketImpl::~SslUdpSocketImpl()
{
}